

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall gl4cts::ShaderSubroutine::APITest2::APITest2(APITest2 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"name_getters",
             "Verifies glGetActiveSubroutineName() and glGetActiveSubroutineUniformName() functions work correctly."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021296b0;
  this->m_buffer = (GLchar *)0x0;
  this->m_has_test_passed = true;
  this->m_po_id = 0;
  this->m_subroutine_name1 = "subroutine1";
  this->m_subroutine_name2 = "subroutine2";
  this->m_subroutine_uniform_name = "data_provider";
  this->m_vs_id = 0;
  return;
}

Assistant:

APITest2::APITest2(deqp::Context& context)
	: TestCase(context, "name_getters", "Verifies glGetActiveSubroutineName() and glGetActiveSubroutineUniformName() "
										"functions work correctly.")
	, m_buffer(DE_NULL)
	, m_has_test_passed(true)
	, m_po_id(0)
	, m_subroutine_name1("subroutine1")
	, m_subroutine_name2("subroutine2")
	, m_subroutine_uniform_name("data_provider")
	, m_vs_id(0)
{
	/* Left blank intentionally */
}